

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

BinsSelectConditionExprSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::BinsSelectConditionExprSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::NameSyntax&,slang::parsing::Token,slang::syntax::IntersectClauseSyntax*>
          (BumpAllocator *this,Token *args,Token *args_1,NameSyntax *args_2,Token *args_3,
          IntersectClauseSyntax **args_4)

{
  Token openParen;
  Token binsof;
  BinsSelectConditionExprSyntax *pBVar1;
  undefined8 *in_RDX;
  Token *in_RSI;
  undefined8 *in_R8;
  IntersectClauseSyntax *in_R9;
  size_t in_stack_ffffffffffffff88;
  BinsSelectConditionExprSyntax *in_stack_ffffffffffffff90;
  BumpAllocator *in_stack_ffffffffffffff98;
  
  pBVar1 = (BinsSelectConditionExprSyntax *)
           allocate(in_stack_ffffffffffffff98,(size_t)in_stack_ffffffffffffff90,
                    in_stack_ffffffffffffff88);
  binsof.info = (Info *)*in_RDX;
  binsof._0_8_ = in_R8[1];
  openParen.info = (Info *)*in_R8;
  openParen._0_8_ = pBVar1;
  slang::syntax::BinsSelectConditionExprSyntax::BinsSelectConditionExprSyntax
            (in_stack_ffffffffffffff90,binsof,openParen,*(NameSyntax **)&in_R9->super_SyntaxNode,
             *in_RSI,in_R9);
  return pBVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }